

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O1

void __thiscall osc::ReceivedMessageArgumentIterator::Advance(ReceivedMessageArgumentIterator *this)

{
  char **ppcVar1;
  char *pcVar2;
  byte bVar3;
  uint uVar4;
  byte *pbVar5;
  uint *puVar6;
  char *pcVar7;
  char *pcVar8;
  
  pbVar5 = (byte *)(this->value_).typeTagPtr_;
  if (pbVar5 != (byte *)0x0) {
    (this->value_).typeTagPtr_ = (char *)(pbVar5 + 1);
    bVar3 = *pbVar5;
    if (bVar3 < 0x4e) {
      if ((bVar3 == 0) || ((bVar3 != 0x46 && (bVar3 != 0x49)))) goto switchD_001064f9_caseD_55;
    }
    else {
      switch(bVar3) {
      case 0x53:
      case 0x73:
        pcVar7 = (this->value_).argumentPtr_;
        if (*pcVar7 == '\0') {
          pcVar8 = pcVar7 + 4;
        }
        else {
          do {
            pcVar8 = pcVar7 + 4;
            pcVar2 = pcVar7 + 3;
            pcVar7 = pcVar8;
          } while (*pcVar2 != '\0');
        }
        (this->value_).argumentPtr_ = pcVar8;
        return;
      case 0x54:
      case 0x5b:
      case 0x5d:
        break;
      case 0x55:
      case 0x56:
      case 0x57:
      case 0x58:
      case 0x59:
      case 0x5a:
      case 0x5c:
      case 0x5e:
      case 0x5f:
      case 0x60:
      case 0x61:
      case 0x65:
      case 0x67:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
switchD_001064f9_caseD_55:
        (this->value_).typeTagPtr_ = (char *)pbVar5;
        return;
      case 0x62:
        puVar6 = (uint *)(this->value_).argumentPtr_;
        uVar4 = *puVar6;
        (this->value_).argumentPtr_ =
             (char *)((long)puVar6 +
                     (ulong)((uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                             uVar4 << 0x18) + 3 & 0xfffffffc) + 4);
        return;
      case 99:
      case 0x66:
      case 0x69:
      case 0x6d:
      case 0x72:
        ppcVar1 = &(this->value_).argumentPtr_;
        *ppcVar1 = *ppcVar1 + 4;
        return;
      case 100:
      case 0x68:
      case 0x74:
        ppcVar1 = &(this->value_).argumentPtr_;
        *ppcVar1 = *ppcVar1 + 8;
        return;
      default:
        if (bVar3 != 0x4e) goto switchD_001064f9_caseD_55;
      }
    }
  }
  return;
}

Assistant:

void ReceivedMessageArgumentIterator::Advance()
{
    if( !value_.typeTagPtr_ )
        return;
        
    switch( *value_.typeTagPtr_++ ){
        case '\0':
            // don't advance past end
            --value_.typeTagPtr_;
            break;
            
        case TRUE_TYPE_TAG:
        case FALSE_TYPE_TAG:
        case NIL_TYPE_TAG:
        case INFINITUM_TYPE_TAG:
        
            // zero length
            break;

        case INT32_TYPE_TAG:
        case FLOAT_TYPE_TAG: 					
        case CHAR_TYPE_TAG:
        case RGBA_COLOR_TYPE_TAG:
        case MIDI_MESSAGE_TYPE_TAG:

            value_.argumentPtr_ += 4;
            break;

        case INT64_TYPE_TAG:
        case TIME_TAG_TYPE_TAG:
        case DOUBLE_TYPE_TAG:
				
            value_.argumentPtr_ += 8;
            break;

        case STRING_TYPE_TAG: 
        case SYMBOL_TYPE_TAG:

            // we use the unsafe function FindStr4End(char*) here because all of
            // the arguments have already been validated in
            // ReceivedMessage::Init() below.
            
            value_.argumentPtr_ = FindStr4End( value_.argumentPtr_ );
            break;

        case BLOB_TYPE_TAG:
            {
                // treat blob size as an unsigned int for the purposes of this calculation
                uint32 blobSize = ToUInt32( value_.argumentPtr_ );
                value_.argumentPtr_ = value_.argumentPtr_ + osc::OSC_SIZEOF_INT32 + RoundUp4( blobSize );
            }
            break;

        case ARRAY_BEGIN_TYPE_TAG:
        case ARRAY_END_TYPE_TAG: 

            //    [ Indicates the beginning of an array. The tags following are for
            //        data in the Array until a close brace tag is reached.
            //    ] Indicates the end of an array.

            // zero length, don't advance argument ptr
            break;

        default:    // unknown type tag
            // don't advance
            --value_.typeTagPtr_;
            break;
    }
}